

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int mapEndSurfaceHeight(float *y,EndNoise *en,SurfaceNoise *sn,int x,int z,int w,int h,int scale,
                       int ymin)

{
  int blockspercell;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int z_00;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double *dz_00;
  uint in_ECX;
  uint uVar9;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  SurfaceNoise *pSVar10;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  double *ncol1;
  double *ncol0;
  double dz;
  double dx;
  int di;
  int ci;
  double *tmp;
  int dj;
  int cj;
  double *ncol [2];
  double *buf;
  int j;
  int i;
  int cw;
  int cz;
  int cx;
  int cellsiz;
  double cellmid;
  int yn;
  int y1;
  int y0;
  int32_t r_4;
  int32_t q_4;
  int32_t r_3;
  int32_t q_3;
  int32_t r_2;
  int32_t q_2;
  int32_t r_1;
  int32_t q_1;
  int32_t r;
  int32_t q;
  bool local_129;
  bool local_121;
  uint3 in_stack_fffffffffffffee4;
  uint colymin;
  uint3 in_stack_fffffffffffffeec;
  uint x_00;
  uint3 in_stack_fffffffffffffef4;
  uint uVar11;
  SurfaceNoise *sn_00;
  double *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff10;
  double *pdVar12;
  double *dx_00;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  double *ncol11;
  int iVar13;
  int iVar14;
  int local_54;
  
  if ((((in_stack_00000010 == 1) || (in_stack_00000010 == 2)) || (in_stack_00000010 == 4)) ||
     (in_stack_00000010 == 8)) {
    blockspercell = in_stack_00000018 >> 2;
    if (blockspercell < 2) {
      blockspercell = 2;
    }
    if (0x11 < blockspercell) {
      blockspercell = 0x11;
    }
    iVar1 = 0x13 - blockspercell;
    if (in_stack_00000010 < 2) {
      pSVar10 = (SurfaceNoise *)0x0;
    }
    else {
      pSVar10 = (SurfaceNoise *)((double)in_stack_00000010 / 16.0);
    }
    uVar2 = (uint)(8 / (long)in_stack_00000010);
    iVar3 = (int)in_ECX / (int)uVar2;
    uVar11 = (uint)in_stack_fffffffffffffef4;
    if ((int)(in_ECX ^ uVar2) < 0) {
      uVar11 = CONCAT13((int)in_ECX % (int)uVar2 != 0,in_stack_fffffffffffffef4);
    }
    iVar4 = iVar3 - (uVar11 >> 0x18);
    z_00 = (int)in_R8D / (int)uVar2;
    x_00 = (uint)in_stack_fffffffffffffeec;
    if ((int)(in_R8D ^ uVar2) < 0) {
      x_00 = CONCAT13((int)in_R8D % (int)uVar2 != 0,in_stack_fffffffffffffeec);
    }
    iVar5 = z_00 - (x_00 >> 0x18);
    uVar9 = (in_ECX + in_R9D) - 1;
    colymin = (uint)in_stack_fffffffffffffee4;
    if ((int)(uVar9 ^ uVar2) < 0) {
      colymin = CONCAT13((int)uVar9 % (int)uVar2 != 0,in_stack_fffffffffffffee4);
    }
    iVar6 = (((int)uVar9 / (int)uVar2 - (colymin >> 0x18)) - iVar4) + 2;
    sn_00 = pSVar10;
    dz_00 = (double *)malloc((long)iVar1 * 8 * (long)iVar6 * 2);
    pdVar12 = dz_00 + iVar1 * iVar6;
    ncol11 = dz_00;
    for (iVar13 = 0; iVar13 < iVar6; iVar13 = iVar13 + 1) {
      sampleNoiseColumnEnd
                (in_stack_ffffffffffffff00,sn_00,(EndNoise *)CONCAT44(uVar11,iVar3),x_00,z_00,
                 colymin,SUB84(in_stack_ffffffffffffff10,0));
    }
    for (iVar13 = 0; iVar13 < in_stack_00000008; iVar13 = iVar13 + 1) {
      uVar9 = in_R8D + iVar13;
      local_121 = (int)(uVar9 ^ uVar2) < 0 && (int)uVar9 % (int)uVar2 != 0;
      iVar7 = (in_R8D + iVar13) - ((int)uVar9 / (int)uVar2 - (uint)local_121) * uVar2;
      if ((iVar13 == 0) || (dx_00 = pdVar12, iVar7 == 0)) {
        dx_00 = dz_00;
        for (iVar14 = 0; dz_00 = pdVar12, iVar14 < iVar6; iVar14 = iVar14 + 1) {
          sampleNoiseColumnEnd
                    (in_stack_ffffffffffffff00,sn_00,(EndNoise *)CONCAT44(uVar11,iVar3),x_00,z_00,
                     colymin,SUB84(in_stack_ffffffffffffff10,0));
        }
      }
      for (iVar14 = 0; iVar14 < in_R9D; iVar14 = iVar14 + 1) {
        uVar9 = in_ECX + iVar14;
        local_129 = (int)(uVar9 ^ uVar2) < 0 && (int)uVar9 % (int)uVar2 != 0;
        in_stack_ffffffffffffff10 = (double)iVar7 / (double)(int)uVar2 + (double)pSVar10;
        in_stack_ffffffffffffff00 =
             dx_00 + (int)((((int)uVar9 / (int)uVar2 - (uint)local_129) - iVar4) * iVar1);
        iVar8 = getSurfaceHeight((double *)CONCAT44(uVar2,iVar4),(double *)CONCAT44(iVar5,iVar6),
                                 (double *)CONCAT44(iVar14,iVar13),ncol11,in_stack_ffffffffffffff4c,
                                 in_stack_ffffffffffffff48,blockspercell,(double)dx_00,(double)dz_00
                                );
        *(float *)(in_RDI + (long)(iVar13 * in_R9D + iVar14) * 4) = (float)iVar8;
      }
      pdVar12 = dx_00;
    }
    free(ncol11);
    local_54 = 0;
  }
  else {
    local_54 = 1;
  }
  return local_54;
}

Assistant:

int mapEndSurfaceHeight(float *y, const EndNoise *en, const SurfaceNoise *sn,
    int x, int z, int w, int h, int scale, int ymin)
{
    if (scale != 1 && scale != 2 && scale != 4 && scale != 8)
        return 1;

    int y0 = ymin >> 2;
    if (y0 <  2) y0 =  2;
    if (y0 > 17) y0 = 17;
    int y1 = 18;
    int yn = y1 - y0 + 1;
    double cellmid = scale > 1 ? scale / 16.0 : 0;
    int cellsiz = 8 / scale;
    int cx = floordiv(x, cellsiz);
    int cz = floordiv(z, cellsiz);
    int cw = floordiv(x + w - 1, cellsiz) - cx + 2;
    int i, j;

    double *buf = malloc(sizeof(double) * yn * cw * 2);
    double *ncol[2];
    ncol[0] = buf;
    ncol[1] = buf + yn * cw;

    for (i = 0; i < cw; i++)
        sampleNoiseColumnEnd(ncol[1]+i*yn, sn, en, cx+i, cz+0, y0, y1);

    for (j = 0; j < h; j++)
    {
        int cj = floordiv(z + j, cellsiz);
        int dj = z + j - cj * cellsiz;
        if (j == 0 || dj == 0)
        {
            double *tmp = ncol[0];
            ncol[0] = ncol[1];
            ncol[1] = tmp;
            for (i = 0; i < cw; i++)
                sampleNoiseColumnEnd(ncol[1]+i*yn, sn, en, cx+i, cj+1, y0, y1);
        }

        for (i = 0; i < w; i++)
        {
            int ci = floordiv(x + i, cellsiz);
            int di = x + i - ci * cellsiz;
            double dx = di / (double) cellsiz + cellmid;
            double dz = dj / (double) cellsiz + cellmid;
            double *ncol0 = ncol[0] + (ci - cx) * yn;
            double *ncol1 = ncol[1] + (ci - cx) * yn;
            y[j*w+i] = getSurfaceHeight(ncol0, ncol1, ncol0+yn, ncol1+yn,
                y0, y1, 4, dx, dz);
        }
    }

    free(buf);
    return 0;
}